

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgcep.cc
# Opt level: O1

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  char *__s;
  double *pdVar9;
  istream *input_stream;
  long lVar10;
  int num_order;
  int fft_length;
  int impulse_response_length;
  int num_iteration;
  double alpha;
  double gamma;
  double relative_floor_in_decibels;
  double epsilon;
  double convergence_threshold;
  double power;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  ostringstream error_message_17;
  vector<double,_std::allocator<double>_> output;
  Buffer buffer_for_power_normalization;
  MelGeneralizedCepstralAnalysis analysis;
  GeneralizedCepstrumGainNormalization generalized_cepstrum_gain_normalization;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  SpectrumToSpectrum spectrum_to_spectrum;
  Buffer buffer_for_cepstral_analysis;
  Buffer buffer_for_spectral_analysis;
  ifstream ifs;
  MelCepstrumPowerNormalization mel_cepstrum_power_normalization;
  WaveformToSpectrum waveform_to_spectrum;
  int local_1210;
  int local_120c;
  string local_1208;
  InputOutputFormats local_11e4;
  int local_11e0;
  int local_11dc;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  ulong local_11b8;
  double local_11b0;
  double local_11a8;
  vector<double,_std::allocator<double>_> local_11a0;
  vector<double,_std::allocator<double>_> local_1188;
  allocator_type local_1170 [112];
  ios_base local_1100 [264];
  vector<double,_std::allocator<double>_> local_ff8;
  undefined1 local_fe0 [32];
  pointer pdStack_fc0;
  pointer local_fb8;
  pointer pdStack_fb0;
  undefined **local_fa8;
  pointer local_fa0;
  pointer pdStack_f98;
  pointer local_f90;
  undefined **local_f88;
  pointer local_f80;
  pointer pdStack_f78;
  pointer local_f70;
  pointer pdStack_f68;
  pointer local_f60;
  pointer pdStack_f58;
  undefined **local_f50;
  pointer local_f48;
  pointer pdStack_f40;
  pointer local_f38;
  pointer pdStack_f30;
  pointer local_f28;
  pointer pdStack_f20;
  MelGeneralizedCepstralAnalysis local_f18;
  GeneralizedCepstrumGainNormalization local_cb0;
  MelCepstrumToMlsaDigitalFilterCoefficients local_c90;
  SpectrumToSpectrum local_c70;
  undefined1 local_c28 [1936];
  Buffer local_498;
  InputOutputFormats local_3d8;
  undefined4 uStack_3d4;
  byte abStack_3b8 [488];
  MelCepstrumPowerNormalization local_1d0;
  WaveformToSpectrum local_120;
  
  local_1210 = 0x19;
  local_11d8 = 0.35;
  local_11d0 = 0.0;
  local_120c = 0x100;
  local_11dc = 0x1e;
  local_11b0 = 0.001;
  local_11b8 = 0;
  local_11c0 = 0.0;
  local_11c8 = -1.79769313486232e+308;
  local_11e0 = 0x80;
  local_11e4 = kNumInputOutputFormats;
  iVar5 = 0;
  do {
    pdVar9 = &local_f18.alpha_;
    iVar4 = ya_getopt_long(argc,argv,"m:a:g:c:l:q:o:i:d:e:E:n:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToDouble((string *)local_c28,&local_11d8);
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_11d8);
        if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
          operator_delete((void *)local_c28._0_8_);
        }
        if (bVar2) goto LAB_001056d8;
      }
      else if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -a option must be in (-1.0, 1.0)",0x35);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x62:
    case 0x66:
    case 0x6a:
    case 0x6b:
    case 0x70:
switchD_00104be8_caseD_62:
      anon_unknown.dwarf_4378::PrintUsage((ostream *)&std::cerr);
      goto LAB_001055e2;
    case 99:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,(int *)&local_3d8);
      bVar1 = (int)local_3d8 < 0;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c28,"The argument for the -c option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c28,"non-negative integer",0x14);
        local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
        if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_f18.alpha_) {
          operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
        std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
        iVar4 = 1;
        iVar5 = 1;
      }
      else {
        local_11d0 = 0.0;
        if (local_3d8 != kLogAmplitudeSpectrumInDecibels) {
          local_11d0 = -1.0 / (double)(int)local_3d8;
        }
        iVar4 = 4;
      }
      if (!bVar2 || bVar1) goto LAB_001056da;
      goto LAB_001056d8;
    case 100:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar1 = sptk::ConvertStringToDouble((string *)local_c28,&local_11b0);
      bVar2 = 0.0 <= local_11b0;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar1 && bVar2) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -d option must be a non-negative number"
                 ,0x3c);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x65:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar1 = sptk::ConvertStringToDouble((string *)local_c28,&local_11c0);
      bVar2 = 0.0 < local_11c0;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar1 && bVar2) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -e option must be a positive number",
                 0x38);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x67:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToDouble((string *)local_c28,&local_11d0);
      if (bVar2) {
        bVar2 = sptk::IsValidGamma(local_11d0);
        if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
          operator_delete((void *)local_c28._0_8_);
        }
        if (bVar2) goto LAB_001056d8;
      }
      else if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -g option must be in [-1.0, 0.0]",0x35);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x68:
      anon_unknown.dwarf_4378::PrintUsage((ostream *)&std::cout);
      iVar5 = 0;
      iVar4 = 1;
      goto LAB_001056da;
    case 0x69:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,&local_11dc);
      bVar1 = -1 < local_11dc;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar2 && bVar1) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,
                 "The argument for the -i option must be a non-negative integer",0x3d);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,&local_120c);
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar2) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -l option must be an integer",0x31);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,&local_1210);
      bVar1 = -1 < local_1210;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar2 && bVar1) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"non-negative integer",0x14);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar1 = sptk::ConvertStringToInteger((string *)local_c28,&local_11e0);
      bVar2 = 0 < local_11e0;
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (bVar1 && bVar2) goto LAB_001056d8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -n option must be a positive integer",
                 0x39);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,(int *)&local_3d8);
      if (!bVar2) {
        if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
          operator_delete((void *)local_c28._0_8_);
        }
LAB_0010539f:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c28,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c28,"in the range of ",0x10);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_c28,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
        std::ostream::operator<<((ostream *)poVar7,4);
        local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
        goto LAB_0010569a;
      }
      bVar2 = sptk::IsInRange(local_3d8,0,4);
      if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      if (!bVar2) goto LAB_0010539f;
      iVar4 = 4;
      bVar2 = true;
      local_11b8 = (ulong)local_3d8;
      goto LAB_001056d4;
    case 0x71:
      std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
      bVar2 = sptk::ConvertStringToInteger((string *)local_c28,(int *)&local_3d8);
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d8,0,4);
        if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
          operator_delete((void *)local_c28._0_8_);
        }
        if (bVar2) {
          iVar4 = 4;
          bVar2 = true;
          local_11e4 = local_3d8;
          goto LAB_001056d4;
        }
      }
      else if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
        operator_delete((void *)local_c28._0_8_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"in the range of ",0x10);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_c28,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
      std::ostream::operator<<((ostream *)poVar7,4);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
LAB_0010569a:
      if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)pdVar9) {
        operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
      std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
      iVar4 = 1;
      bVar2 = false;
      iVar5 = 1;
LAB_001056d4:
      if (bVar2) {
LAB_001056d8:
        iVar4 = 0;
      }
      goto LAB_001056da;
    default:
      if (iVar4 != -1) {
        if (iVar4 != 0x45) goto switchD_00104be8_caseD_62;
        std::__cxx11::string::string((string *)local_c28,ya_optarg,(allocator *)&local_f18);
        bVar1 = sptk::ConvertStringToDouble((string *)local_c28,&local_11c8);
        bVar2 = local_11c8 < 0.0;
        if ((undefined1 *)local_c28._0_8_ != local_c28 + 0x10) {
          operator_delete((void *)local_c28._0_8_);
        }
        if (bVar1 && bVar2) goto LAB_001056d8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_c28,"The argument for the -E option must be a negative number",
                   0x38);
        local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)&local_f18.alpha_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
        sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
        break;
      }
      iVar4 = 2;
      goto LAB_001056da;
    }
    if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)&local_f18.alpha_) {
      operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
    std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
LAB_001055e2:
    iVar4 = 1;
    iVar5 = 1;
LAB_001056da:
    input_format = local_11e4;
    pdVar9 = &local_f18.alpha_;
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar5;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_c28,"Too many input files",0x14);
    local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
    sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
LAB_001058ca:
    if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)pdVar9) {
      operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
    std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
    return 1;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_c28,"Cannot set translation mode",0x1b);
    local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
    sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
    goto LAB_001058ca;
  }
  input_stream = (istream *)&local_3d8;
  std::ifstream::ifstream(input_stream);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_3d8,(_Ios_Openmode)__s),
     (abStack_3b8[*(long *)(CONCAT44(uStack_3d4,local_3d8) + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_c28,"Cannot open file ",0x11);
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c28,__s,sVar8);
    local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
    sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
    if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)pdVar9) {
      operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
    std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
    iVar5 = 1;
    goto LAB_0010603e;
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    input_stream = (istream *)&std::cin;
  }
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            (&local_c70,local_120c,input_format,kPowerSpectrum,local_11c0,local_11c8);
  if ((input_format == kNumInputOutputFormats) || (local_c70.is_valid_ != false)) {
    sptk::WaveformToSpectrum::WaveformToSpectrum
              (&local_120,local_120c,local_120c,kPowerSpectrum,local_11c0,local_11c8);
    local_498._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1c8;
    local_498.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1f8;
    local_498.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
         (_func_int **)&PTR__Buffer_0011f228;
    memset(&local_498.buffer_.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
    if ((input_format == kNumInputOutputFormats) &&
       (local_120.filter_coefficients_to_spectrum_.is_valid_ == false)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c28,"Failed to set condition for spectral analysis",0x2d);
      local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
      sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
      if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)pdVar9) {
        operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
      std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
      iVar5 = 1;
    }
    else {
      sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
                (&local_f18,local_120c,local_1210,local_11d8,local_11d0,local_11dc,local_11b0);
      sptk::MelGeneralizedCepstralAnalysis::Buffer::Buffer((Buffer *)local_c28);
      if (local_f18.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1170,"Failed to set condition for cepstral analysis",0x2d);
        local_fe0._0_8_ = local_fe0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"mgcep","");
        sptk::PrintErrorMessage((string *)local_fe0,(ostringstream *)local_1170);
LAB_00105fb6:
        if ((undefined1 *)local_fe0._0_8_ != local_fe0 + 0x10) {
          operator_delete((void *)local_fe0._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
        std::ios_base::~ios_base(local_1100);
        iVar5 = 1;
      }
      else {
        sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
                  (&local_c90,local_1210,local_11d8);
        if (local_c90.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1170,"Failed to set condition for output formatting",0x2d);
          local_fe0._0_8_ = local_fe0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)local_fe0,(ostringstream *)local_1170);
          goto LAB_00105fb6;
        }
        sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                  (&local_cb0,local_1210,local_11d0);
        if (local_cb0.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1170,"Failed to set condition for gain normalization",0x2e);
          local_fe0._0_8_ = local_fe0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"mgcep","");
          sptk::PrintErrorMessage((string *)local_fe0,(ostringstream *)local_1170);
          goto LAB_00105fb6;
        }
        sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
                  (&local_1d0,local_1210,local_11e0,local_11d8);
        local_fe0._0_8_ = &PTR__Buffer_0011f378;
        local_fe0._8_8_ = (pointer)0x0;
        local_fe0._16_8_ = (pointer)0x0;
        local_fe0._24_8_ = (pointer)0x0;
        pdStack_fc0 = (pointer)0x0;
        local_fb8 = (pointer)0x0;
        pdStack_fb0 = (pointer)0x0;
        local_fa8 = &PTR__Buffer_0011f318;
        local_fa0 = (pointer)0x0;
        pdStack_f98 = (pointer)0x0;
        local_f90 = (pointer)0x0;
        local_f88 = &PTR__Buffer_0011f3a8;
        local_f80 = (pointer)0x0;
        pdStack_f78 = (pointer)0x0;
        local_f70 = (pointer)0x0;
        pdStack_f68 = (pointer)0x0;
        local_f60 = (pointer)0x0;
        pdStack_f58 = (pointer)0x0;
        local_f50 = &PTR__Buffer_0011f228;
        local_f48 = (pointer)0x0;
        pdStack_f40 = (pointer)0x0;
        local_f38 = (pointer)0x0;
        pdStack_f30 = (pointer)0x0;
        local_f28 = (pointer)0x0;
        pdStack_f20 = (pointer)0x0;
        if (local_1d0.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1170,"Failed to set condition for power normalization",0x2f);
          local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
          sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
            operator_delete(local_1208._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
          std::ios_base::~ios_base(local_1100);
          iVar5 = 1;
        }
        else {
          iVar5 = local_120c;
          if (input_format != kNumInputOutputFormats) {
            iVar5 = local_120c / 2 + 1;
          }
          lVar10 = (long)local_1210;
          std::vector<double,_std::allocator<double>_>::vector(&local_1188,(long)iVar5,local_1170);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_11a0,(long)(local_120c / 2 + 1),local_1170);
          std::vector<double,_std::allocator<double>_>::vector(&local_ff8,lVar10 + 1U,local_1170);
          uVar6 = (uint)local_11b8;
          do {
            bVar2 = sptk::ReadStream<double>(false,0,0,iVar5,&local_1188,input_stream,(int *)0x0);
            if (!bVar2) {
              iVar5 = 0;
              goto LAB_001063b8;
            }
            if (local_11e4 == kNumInputOutputFormats) {
              bVar2 = sptk::WaveformToSpectrum::Run(&local_120,&local_1188,&local_11a0,&local_498);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1170,"Failed to transform waveform to spectrum",0x28);
                local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
                sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
                goto LAB_00106383;
              }
            }
            else {
              bVar2 = sptk::SpectrumToSpectrum::Run(&local_c70,&local_1188,&local_11a0);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1170,"Failed to convert spectrum",0x1a);
                local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
                sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
                goto LAB_00106383;
              }
            }
            bVar2 = sptk::MelGeneralizedCepstralAnalysis::Run
                              (&local_f18,&local_11a0,&local_ff8,(Buffer *)local_c28);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1170,"Failed to run mel-generalized cepstral analysis",
                         0x2f);
              local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
              sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
              goto LAB_00106383;
            }
            if ((((local_11d8 != 0.0) || (NAN(local_11d8))) && ((uVar6 & 0xfffffffd) == 1)) &&
               (bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run(&local_c90,&local_ff8)
               , !bVar2)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1170,"Failed to convert to MLSA filter coefficients",0x2d)
              ;
              local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
              sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
              goto LAB_00106383;
            }
            if (((uVar6 & 0xfffffffe) == 2) &&
               (bVar2 = sptk::GeneralizedCepstrumGainNormalization::Run(&local_cb0,&local_ff8),
               !bVar2)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1170,"Failed to gain-normalize cepstrum",0x21);
              local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
              sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
              goto LAB_00106383;
            }
            if ((int)local_11b8 == 4) {
              bVar2 = sptk::MelCepstrumPowerNormalization::Run
                                (&local_1d0,&local_ff8,&local_11a8,(Buffer *)local_fe0);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1170,"Failed to power-normalize cepstrum",0x22);
                local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
                sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
                goto LAB_00106383;
              }
              bVar2 = sptk::WriteStream<double>(local_11a8,(ostream *)&std::cout);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1170,"Failed to write power",0x15);
                local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
                sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
                goto LAB_00106383;
              }
            }
            bVar2 = sptk::WriteStream<double>
                              (0,(int)(lVar10 + 1U),&local_ff8,(ostream *)&std::cout,(int *)0x0);
          } while (bVar2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1170);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1170,"Failed to write mel-generalized cepstrum",0x28);
          local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"mgcep","");
          sptk::PrintErrorMessage(&local_1208,(ostringstream *)local_1170);
LAB_00106383:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
            operator_delete(local_1208._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1170);
          std::ios_base::~ios_base(local_1100);
          iVar5 = 1;
LAB_001063b8:
          if (local_ff8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_ff8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_11a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_11a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_1188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        sptk::MelCepstrumPowerNormalization::Buffer::~Buffer((Buffer *)local_fe0);
        local_1d0._vptr_MelCepstrumPowerNormalization =
             (_func_int **)&PTR__MelCepstrumPowerNormalization_0011f3d8;
        local_1d0.cepstrum_to_autocorrelation_._vptr_CepstrumToAutocorrelation =
             (_func_int **)&PTR__CepstrumToAutocorrelation_0011f408;
        sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
                  (&local_1d0.cepstrum_to_autocorrelation_.fast_fourier_transform_);
      }
      sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer((Buffer *)local_c28);
      sptk::MelGeneralizedCepstralAnalysis::~MelGeneralizedCepstralAnalysis(&local_f18);
    }
    local_498._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f1c8;
    sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_498.buffer_);
    sptk::WaveformToSpectrum::~WaveformToSpectrum(&local_120);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_c28,"Failed to set condition for input formatting",0x2c);
    local_f18._vptr_MelGeneralizedCepstralAnalysis = (_func_int **)pdVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"mgcep","");
    sptk::PrintErrorMessage((string *)&local_f18,(ostringstream *)local_c28);
    if (local_f18._vptr_MelGeneralizedCepstralAnalysis != (_func_int **)pdVar9) {
      operator_delete(local_f18._vptr_MelGeneralizedCepstralAnalysis);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
    std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
    iVar5 = 1;
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_c70);
LAB_0010603e:
  std::ifstream::~ifstream(&local_3d8);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);
  double gamma(kDefaultGamma);
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  int impulse_response_length(kDefaultImpulseResponseLength);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:l:q:o:i:d:e:E:n:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 0.0]";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        gamma = (0 == tmp) ? 0.0 : -1.0 / tmp;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &impulse_response_length) ||
            impulse_response_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelGeneralizedCepstralAnalysis analysis(fft_length, num_order, alpha,
                                                gamma, num_iteration,
                                                convergence_threshold);
  sptk::MelGeneralizedCepstralAnalysis::Buffer buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for cepstral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for output formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::GeneralizedCepstrumGainNormalization
      generalized_cepstrum_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for gain normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumPowerNormalization mel_cepstrum_power_normalization(
      num_order, impulse_response_length, alpha);
  sptk::MelCepstrumPowerNormalization::Buffer buffer_for_power_normalization;
  if (!mel_cepstrum_power_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for power normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double power;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral analysis";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }

    // mc -> b
    if (0.0 != alpha &&
        (kMlsaFilterCoefficients == output_format ||
         kGainNormalizedMlsaFilterCoefficients == output_format)) {
      if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to convert to MLSA filter coefficients";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // gnorm
    if (kGainNormalizedCepstrum == output_format ||
        kGainNormalizedMlsaFilterCoefficients == output_format) {
      if (!generalized_cepstrum_gain_normalization.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to gain-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // pnorm
    if (kPowerNormalizedCepstrum == output_format) {
      if (!mel_cepstrum_power_normalization.Run(
              &output, &power, &buffer_for_power_normalization)) {
        std::ostringstream error_message;
        error_message << "Failed to power-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
      if (!sptk::WriteStream(power, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write power";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }

  return 0;
}